

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prlefreader.cpp
# Opt level: O3

void __thiscall PRLEFReader::doIntegrityChecks(PRLEFReader *this)

{
  LEFCellInfo_t *pLVar1;
  char *format;
  
  pLVar1 = this->m_parseCell;
  if (pLVar1 == (LEFCellInfo_t *)0x0) {
    format = "PRLEFReader: cannot do integrity checks on a NULL cell\n";
  }
  else {
    if ((pLVar1->m_foreign)._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&pLVar1->m_foreign);
      pLVar1 = this->m_parseCell;
    }
    if ((pLVar1->m_name)._M_string_length != 0) {
      if ((pLVar1->m_sx != 0.0) || (NAN(pLVar1->m_sx))) {
        if ((pLVar1->m_sy != 0.0) || (NAN(pLVar1->m_sy))) {
          return;
        }
      }
      doLog(8,"PRLEFReader: cell %s has zero width or height\n",(pLVar1->m_name)._M_dataplus._M_p);
      return;
    }
    format = "PRLEFReader: current cell has no name!\n";
  }
  doLog(8,format);
  return;
}

Assistant:

void PRLEFReader::doIntegrityChecks()
{
    // perform integrity checks on the current cell
    if (m_parseCell == nullptr)
    {
        doLog(LOG_ERROR, "PRLEFReader: cannot do integrity checks on a NULL cell\n");
        return;
    }

    if (m_parseCell->m_foreign.empty())
    {
        m_parseCell->m_foreign = m_parseCell->m_name;
    }

    if (m_parseCell->m_name.empty())
    {
        doLog(LOG_ERROR, "PRLEFReader: current cell has no name!\n");
        return;
    }

    if ((m_parseCell->m_sx == 0.0) || (m_parseCell->m_sy == 0.0))
    {
        doLog(LOG_ERROR,"PRLEFReader: cell %s has zero width or height\n",
            m_parseCell->m_name.c_str());
    }
}